

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextVkImpl::GetTileSize
          (DeviceContextVkImpl *this,Uint32 *TileSizeX,Uint32 *TileSizeY)

{
  VkExtent2D Granularity;
  VkExtent2D local_20;
  
  *TileSizeX = 0;
  *TileSizeY = 0;
  if (this->m_vkRenderPass != (VkRenderPass)0x0) {
    local_20.width = 0;
    local_20.height = 0;
    (*vkGetRenderAreaGranularity)
              (((((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                  super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject)->
                m_LogicalVkDevice).
                super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->m_VkDevice,this->m_vkRenderPass,&local_20);
    *TileSizeX = local_20.width;
    *TileSizeY = local_20.height;
  }
  return;
}

Assistant:

void DeviceContextVkImpl::GetTileSize(Uint32& TileSizeX, Uint32& TileSizeY)
{
    TileSizeX = 0;
    TileSizeY = 0;

    if (m_vkRenderPass != VK_NULL_HANDLE)
    {
        const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_pDevice->GetLogicalDevice();
        VkExtent2D                                  Granularity   = {};
        vkGetRenderAreaGranularity(LogicalDevice.GetVkDevice(), m_vkRenderPass, &Granularity);

        TileSizeX = Granularity.width;
        TileSizeY = Granularity.height;
    }
}